

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

listener_config_t *
add_listener(int fd,sockaddr *addr,socklen_t addrlen,int is_global,int proxy_protocol)

{
  listener_config_t **pplVar1;
  listener_config_t *plVar2;
  h2o_hostconf_t ***ppphVar3;
  listener_config_t **pplVar4;
  
  plVar2 = (listener_config_t *)malloc(0xb8);
  if (plVar2 != (listener_config_t *)0x0) {
    memcpy(&plVar2->addr,addr,(ulong)addrlen);
    plVar2->fd = fd;
    plVar2->addrlen = addrlen;
    if (is_global == 0) {
      ppphVar3 = (h2o_hostconf_t ***)malloc(8);
      if (ppphVar3 == (h2o_hostconf_t ***)0x0) goto LAB_0018d35b;
      plVar2->hosts = (h2o_hostconf_t **)ppphVar3;
    }
    else {
      ppphVar3 = &plVar2->hosts;
    }
    *ppphVar3 = (h2o_hostconf_t **)0x0;
    (plVar2->ssl).capacity = 0;
    (plVar2->ssl).entries = (listener_ssl_config_t **)0x0;
    (plVar2->ssl).size = 0;
    plVar2->proxy_protocol = proxy_protocol;
    pplVar4 = (listener_config_t **)realloc(conf.listeners,conf.num_listeners * 8 + 8);
    if (pplVar4 != (listener_config_t **)0x0) {
      pplVar1 = pplVar4 + conf.num_listeners;
      conf.listeners = pplVar4;
      conf.num_listeners = conf.num_listeners + 1;
      *pplVar1 = plVar2;
      return plVar2;
    }
    h2o__fatal(
              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:338:no memory"
              );
  }
LAB_0018d35b:
  h2o__fatal(
            "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
            );
}

Assistant:

static struct listener_config_t *add_listener(int fd, struct sockaddr *addr, socklen_t addrlen, int is_global, int proxy_protocol)
{
    struct listener_config_t *listener = h2o_mem_alloc(sizeof(*listener));

    memcpy(&listener->addr, addr, addrlen);
    listener->fd = fd;
    listener->addrlen = addrlen;
    if (is_global) {
        listener->hosts = NULL;
    } else {
        listener->hosts = h2o_mem_alloc(sizeof(listener->hosts[0]));
        listener->hosts[0] = NULL;
    }
    memset(&listener->ssl, 0, sizeof(listener->ssl));
    listener->proxy_protocol = proxy_protocol;

    conf.listeners = h2o_mem_realloc(conf.listeners, sizeof(*conf.listeners) * (conf.num_listeners + 1));
    conf.listeners[conf.num_listeners++] = listener;

    return listener;
}